

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O0

bool llvm::DWARFUnit::isMatchingUnitTypeAndTag(uint8_t UnitType,Tag Tag)

{
  bool local_9;
  Tag Tag_local;
  uint8_t UnitType_local;
  
  switch(UnitType) {
  case '\x01':
    local_9 = Tag == DW_TAG_compile_unit;
    break;
  case '\x02':
    local_9 = Tag == DW_TAG_type_unit;
    break;
  case '\x03':
    local_9 = Tag == DW_TAG_partial_unit;
    break;
  case '\x04':
    local_9 = Tag == DW_TAG_skeleton_unit;
    break;
  case '\x05':
  case '\x06':
    local_9 = dwarf::isUnitType(Tag);
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool isMatchingUnitTypeAndTag(uint8_t UnitType, dwarf::Tag Tag) {
    switch (UnitType) {
    case dwarf::DW_UT_compile:
      return Tag == dwarf::DW_TAG_compile_unit;
    case dwarf::DW_UT_type:
      return Tag == dwarf::DW_TAG_type_unit;
    case dwarf::DW_UT_partial:
      return Tag == dwarf::DW_TAG_partial_unit;
    case dwarf::DW_UT_skeleton:
      return Tag == dwarf::DW_TAG_skeleton_unit;
    case dwarf::DW_UT_split_compile:
    case dwarf::DW_UT_split_type:
      return dwarf::isUnitType(Tag);
    }
    return false;
  }